

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O2

void test_send_text_binary_frame(void)

{
  frame_direction fVar1;
  cio_websocket *websocket;
  ulong __n;
  _Bool _Var2;
  cio_error cVar3;
  void *pvVar4;
  char *__s;
  long actual;
  uint uVar5;
  uint32_t context;
  char *local_c0;
  ulong local_b8;
  long local_b0;
  cio_write_buffer local_a8;
  long local_88;
  void *local_80;
  ws_frame local_78;
  cio_write_buffer wb;
  
  local_88 = 0;
  do {
    if (local_88 == 6) {
      return;
    }
    local_b8 = (ulong)(uint)(&DAT_00110fc0)[local_88];
    for (uVar5 = 0; uVar5 != 2; uVar5 = uVar5 + 1) {
      for (local_b0 = 0; __n = local_b8, local_b0 != 8; local_b0 = local_b0 + 4) {
        fVar1 = *(frame_direction *)((long)&DAT_00110fe8 + local_b0);
        pvVar4 = malloc(local_b8);
        if (pvVar4 == (void *)0x0) {
          UnityFail("Could not allocate memory for test frame!",0x9f1);
        }
        memset(pvVar4,0x61,__n);
        __s = (char *)malloc(__n);
        if (__s == (char *)0x0) {
          UnityFail("Could not allocate memory for check frame!",0x9f6);
        }
        local_c0 = __s;
        memset(__s,0x61,__n);
        local_78.frame_type = CIO_WEBSOCKET_CLOSE_FRAME;
        local_78.data = (void *)0x0;
        local_78.data_length = 0;
        local_78.last_frame = true;
        local_78.rsv = false;
        local_78.direction = fVar1;
        serialize_frames(&local_78,1);
        websocket = ws;
        wb.data.element.length = __n;
        local_a8.next = &wb;
        local_a8.data.head.q_len = 1;
        local_a8.data.element.length = __n;
        *(ushort *)&(ws->ws_private).ws_flags =
             SUB42((ws->ws_private).ws_flags,0) & 0xfbff | (ushort)(local_b0 == 0) << 10;
        context = 0x1234568;
        local_a8.prev = local_a8.next;
        local_80 = pvVar4;
        wb.next = &local_a8;
        wb.prev = &local_a8;
        wb.data.head.q_len = (size_t)pvVar4;
        if ((uVar5 & 1) == 0) {
          cVar3 = cio_websocket_write_message_first_chunk
                            (websocket,__n,&local_a8,true,true,write_handler,&context);
          UnityAssertEqualNumber
                    (0,(long)cVar3,"Writing a binary frame did not succeed!",0xa0f,
                     UNITY_DISPLAY_STYLE_INT);
          _Var2 = check_frame(CIO_WEBSOCKET_BINARY_FRAME,local_c0,__n,true);
          if (!_Var2) {
            UnityFail("First frame send is incorrect binary frame!",0xa10);
          }
        }
        else {
          cVar3 = cio_websocket_write_message_first_chunk
                            (websocket,__n,&local_a8,true,false,write_handler,&context);
          UnityAssertEqualNumber
                    (0,(long)cVar3,"Writing a text frame did not succeed!",0xa0b,
                     UNITY_DISPLAY_STYLE_INT);
          _Var2 = check_frame(CIO_WEBSOCKET_TEXT_FRAME,local_c0,__n,true);
          if (!_Var2) {
            UnityFail("First frame send is incorrect text frame!",0xa0c);
          }
        }
        cVar3 = cio_websocket_read_message(ws,read_handler,(void *)0x0);
        actual = (long)cVar3;
        UnityAssertEqualNumber
                  (0,actual,"Could not start reading a message!",0xa14,UNITY_DISPLAY_STYLE_INT);
        _Var2 = is_close_frame(1000,SUB81(actual,0));
        if (!_Var2) {
          UnityFail("written frame is not a close frame!",0xa15);
        }
        UnityAssertEqualNumber
                  (1,(ulong)write_handler_fake.call_count,"write handler was not called!",0xa17,
                   UNITY_DISPLAY_STYLE_INT);
        UnityAssertEqualNumber
                  ((UNITY_INT)ws,(UNITY_INT)write_handler_fake.arg0_val,
                   "websocket pointer in write handler not correct!",0xa18,UNITY_DISPLAY_STYLE_HEX64
                  );
        UnityAssertEqualNumber
                  ((UNITY_INT)&context,(UNITY_INT)write_handler_fake.arg1_val,
                   "context pointer in write handler not correct!",0xa19,UNITY_DISPLAY_STYLE_HEX64);
        UnityAssertEqualNumber
                  (0,(long)write_handler_fake.arg2_val,"error code in write handler not correct!",
                   0xa1a,UNITY_DISPLAY_STYLE_INT);
        UnityAssertEqualNumber
                  (1,local_a8.data.head.q_len,
                   "Length of write buffer different than before writing!",0xa1c,
                   UNITY_DISPLAY_STYLE_INT);
        UnityAssertEqualNumber
                  ((UNITY_INT)&local_a8,(UNITY_INT)(local_a8.next)->next,
                   "Concatenation of write buffers no longer correct after writing!",0xa1d,
                   UNITY_DISPLAY_STYLE_INT);
        pvVar4 = local_80;
        UnityAssertEqualMemory
                  (local_80,((local_a8.next)->data).element.field_0.const_data,
                   (UNITY_UINT32)local_b8,1,"Content of writebuffer not correct after writing!",
                   0xa1e,UNITY_ARRAY_TO_ARRAY);
        UnityAssertEqualNumber
                  (0,(ulong)on_error_fake.call_count,"error callback was called",0xa20,
                   UNITY_DISPLAY_STYLE_INT);
        UnityAssertEqualNumber
                  (1,(ulong)on_control_fake.call_count,
                   "control callback was called not for last close frame",0xa21,
                   UNITY_DISPLAY_STYLE_INT);
        free(pvVar4);
        free(local_c0);
        free(ws);
        setUp();
      }
    }
    local_88 = local_88 + 1;
  } while( true );
}

Assistant:

static void test_send_text_binary_frame(void)
{
	uint32_t frame_sizes[] = {1, 5, 125, 126, 65535, 65536};
	unsigned int frame_types[] = {CIO_WEBSOCKET_BINARY_FRAME, CIO_WEBSOCKET_TEXT_FRAME};
	enum frame_direction directions[] = {FROM_CLIENT, FROM_SERVER};

	for (unsigned int i = 0; i < ARRAY_SIZE(frame_sizes); i++) {
		for (unsigned int j = 0; j < ARRAY_SIZE(frame_types); j++) {
			for (unsigned int k = 0; k < ARRAY_SIZE(directions); k++) {
				enum frame_direction direction = directions[k];
				uint32_t frame_size = frame_sizes[i];
				char *data = malloc(frame_size);
				if (data == NULL) {
					TEST_FAIL_MESSAGE("Could not allocate memory for test frame!");
				}
				memset(data, 'a', frame_size);
				char *check_data = malloc(frame_size);
				if (check_data == NULL) {
					TEST_FAIL_MESSAGE("Could not allocate memory for check frame!");
				}
				memcpy(check_data, data, frame_size);

				struct ws_frame frames[] = {
				    {.frame_type = CIO_WEBSOCKET_CLOSE_FRAME, .direction = direction, .data = NULL, .data_length = 0, .last_frame = true, .rsv = false},
				};

				serialize_frames(frames, ARRAY_SIZE(frames));

				struct cio_write_buffer wbh;
				cio_write_buffer_head_init(&wbh);

				struct cio_write_buffer wb;
				cio_write_buffer_element_init(&wb, data, frame_size);
				cio_write_buffer_queue_tail(&wbh, &wb);

				ws->ws_private.ws_flags.is_server = (frames[0].direction == FROM_CLIENT) ? 1 : 0;
				uint32_t context = 0x1234568;
				if (frame_types[j] == CIO_WEBSOCKET_TEXT_FRAME) {
					enum cio_error err = cio_websocket_write_message_first_chunk(ws, cio_write_buffer_get_total_size(&wbh), &wbh, true, false, write_handler, &context);
					TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a text frame did not succeed!");
					TEST_ASSERT_MESSAGE(check_frame(CIO_WEBSOCKET_TEXT_FRAME, check_data, frame_size, true), "First frame send is incorrect text frame!");
				} else if (frame_types[j] == CIO_WEBSOCKET_BINARY_FRAME) {
					enum cio_error err = cio_websocket_write_message_first_chunk(ws, cio_write_buffer_get_total_size(&wbh), &wbh, true, true, write_handler, &context);
					TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a binary frame did not succeed!");
					TEST_ASSERT_MESSAGE(check_frame(CIO_WEBSOCKET_BINARY_FRAME, check_data, frame_size, true), "First frame send is incorrect binary frame!");
				}

				enum cio_error err = cio_websocket_read_message(ws, read_handler, NULL);
				TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");
				TEST_ASSERT_MESSAGE(is_close_frame(CIO_WEBSOCKET_CLOSE_NORMAL, true), "written frame is not a close frame!");

				TEST_ASSERT_EQUAL_MESSAGE(1, write_handler_fake.call_count, "write handler was not called!");
				TEST_ASSERT_EQUAL_PTR_MESSAGE(ws, write_handler_fake.arg0_val, "websocket pointer in write handler not correct!");
				TEST_ASSERT_EQUAL_PTR_MESSAGE(&context, write_handler_fake.arg1_val, "context pointer in write handler not correct!");
				TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, write_handler_fake.arg2_val, "error code in write handler not correct!");

				TEST_ASSERT_EQUAL_MESSAGE(1, cio_write_buffer_get_num_buffer_elements(&wbh), "Length of write buffer different than before writing!");
				TEST_ASSERT_EQUAL_MESSAGE(&wbh, wbh.next->next, "Concatenation of write buffers no longer correct after writing!");
				TEST_ASSERT_EQUAL_MEMORY_MESSAGE(data, wbh.next->data.element.data, frame_size, "Content of writebuffer not correct after writing!");

				TEST_ASSERT_EQUAL_MESSAGE(0, on_error_fake.call_count, "error callback was called");
				TEST_ASSERT_EQUAL_MESSAGE(1, on_control_fake.call_count, "control callback was called not for last close frame");

				if (data) {
					free(data);
				}

				if (check_data) {
					free(check_data);
				}

				free(ws);
				setUp();
			}
		}
	}
}